

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D5xNvmFlash.cpp
# Opt level: O0

void __thiscall D5xNvmFlash::readPage(D5xNvmFlash *this,uint32_t page,uint8_t *buf)

{
  FlashPageError *this_00;
  uint8_t *buf_local;
  uint32_t page_local;
  D5xNvmFlash *this_local;
  
  if ((this->super_Flash)._pages <= page) {
    this_00 = (FlashPageError *)__cxa_allocate_exception(8);
    FlashPageError::FlashPageError(this_00);
    __cxa_throw(this_00,&FlashPageError::typeinfo,FlashPageError::~FlashPageError);
  }
  Samba::read((this->super_Flash)._samba,
              (this->super_Flash)._addr + page * (this->super_Flash)._size,buf,
              (ulong)(this->super_Flash)._size);
  return;
}

Assistant:

void
D5xNvmFlash::readPage(uint32_t page, uint8_t* buf)
{
    if (page >= _pages)
    {
        throw FlashPageError();
    }

    _samba.read(_addr + (page * _size), buf, _size);
}